

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

double __thiscall libtorrent::upnp::log(upnp *this,double __x)

{
  char in_AL;
  int iVar1;
  char *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  va_list v;
  undefined1 local_4c8 [48];
  double local_498;
  char msg [1024];
  
  if (in_AL != '\0') {
    local_498 = __x;
  }
  iVar1 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
  dVar2 = extraout_XMM0_Qa;
  if ((char)iVar1 != '\0') {
    v[0].reg_save_area = local_4c8;
    v[0].overflow_arg_area = &stack0x00000008;
    v[0].gp_offset = 0x10;
    v[0].fp_offset = 0x30;
    vsnprintf(msg,0x400,in_RSI,v);
    (*this->m_callback->_vptr_portmap_callback[2])(this->m_callback,1,msg,&this->m_listen_handle);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void upnp::log(char const* fmt, ...) const
{
	TORRENT_ASSERT(is_single_thread());
	if (!should_log()) return;
	va_list v;
	va_start(v, fmt);
	char msg[1024];
	std::vsnprintf(msg, sizeof(msg), fmt, v);
	va_end(v);
	m_callback.log_portmap(portmap_transport::upnp, msg, m_listen_handle);
}